

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_operations.hpp
# Opt level: O0

rt_expression_interface<double> *
viennamath::diff_impl<viennamath::rt_expression_interface<double>,double>
          (long *e,undefined8 param_2)

{
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *this;
  rt_expression_interface<double> *lhs;
  op_interface_type *op;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *this_00;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> *this_01;
  rt_expression_interface<double> *prVar1;
  op_unary<viennamath::op_cos<double>,_viennamath::rt_expression_interface<double>_> *poVar2;
  op_interface_type *op_00;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> *this_02;
  rt_expression_interface<double> *diff_var_local;
  rt_expression_interface<double> *e_local;
  
  this = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x20);
  lhs = (rt_expression_interface<double> *)(**(code **)(*e + 0x90))(e,param_2);
  op = (op_interface_type *)operator_new(8);
  op->_vptr_op_interface = (_func_int **)0x0;
  op_binary<viennamath::op_div<double>,_viennamath::rt_expression_interface<double>_>::op_binary
            ((op_binary<viennamath::op_div<double>,_viennamath::rt_expression_interface<double>_> *)
             op);
  this_00 = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x20);
  this_01 = (rt_unary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x18);
  prVar1 = (rt_expression_interface<double> *)(**(code **)(*e + 0x10))();
  poVar2 = (op_unary<viennamath::op_cos<double>,_viennamath::rt_expression_interface<double>_> *)
           operator_new(0x10);
  op_unary<viennamath::op_cos<double>,_viennamath::rt_expression_interface<double>_>::op_unary
            (poVar2);
  rt_unary_expr<viennamath::rt_expression_interface<double>_>::rt_unary_expr
            (this_01,prVar1,(op_interface_type *)poVar2);
  op_00 = (op_interface_type *)operator_new(8);
  op_00->_vptr_op_interface = (_func_int **)0x0;
  op_binary<viennamath::op_mult<double>,_viennamath::rt_expression_interface<double>_>::op_binary
            ((op_binary<viennamath::op_mult<double>,_viennamath::rt_expression_interface<double>_> *
             )op_00);
  this_02 = (rt_unary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x18);
  prVar1 = (rt_expression_interface<double> *)(**(code **)(*e + 0x10))();
  poVar2 = (op_unary<viennamath::op_cos<double>,_viennamath::rt_expression_interface<double>_> *)
           operator_new(0x10);
  op_unary<viennamath::op_cos<double>,_viennamath::rt_expression_interface<double>_>::op_unary
            (poVar2);
  rt_unary_expr<viennamath::rt_expression_interface<double>_>::rt_unary_expr
            (this_02,prVar1,(op_interface_type *)poVar2);
  rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (this_00,(rt_expression_interface<double> *)this_01,op_00,
             (rt_expression_interface<double> *)this_02);
  rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (this,lhs,op,(rt_expression_interface<double> *)this_00);
  return &this->super_rt_expression_interface<double>;
}

Assistant:

InterfaceType * diff_impl(const InterfaceType * e, op_tan<NumericT>, const InterfaceType * diff_var)
  {
    // 1/cos^2(e):
    return new rt_binary_expr<InterfaceType>( e->diff(diff_var),
                                              new op_binary<op_div<typename InterfaceType::numeric_type>, InterfaceType>(),
                                              new rt_binary_expr<InterfaceType>( new rt_unary_expr<InterfaceType>(e->clone(),
                                                                                                                  new op_unary<op_cos<NumericT>, InterfaceType>()),
                                                                                 new op_binary<op_mult<typename InterfaceType::numeric_type>, InterfaceType>(),
                                                                                 new rt_unary_expr<InterfaceType>(e->clone(),
                                                                                                                  new op_unary<op_cos<NumericT>, InterfaceType>()) )
                                            );
  }